

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverlayStack.cpp
# Opt level: O1

void __thiscall cursespp::OverlayStack::Push(OverlayStack *this,ILayoutPtr *layout)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar2;
  __normal_iterator<std::shared_ptr<cursespp::ILayout>_*,_std::vector<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>_>
  __position;
  
  peVar1 = (layout->super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (layout->super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (peVar1 == (element_type *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(peVar1,&ILayout::typeinfo,&IOverlay::typeinfo,0xfffffffffffffffe
                                   );
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x10))(plVar2,this);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<cursespp::ILayout>*,std::vector<std::shared_ptr<cursespp::ILayout>,std::allocator<std::shared_ptr<cursespp::ILayout>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<cursespp::ILayout>const>>
                         ((this->stack).
                          super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->stack).
                          super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,layout);
  if (__position._M_current !=
      (this->stack).
      super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
    ::_M_erase(&this->stack,(iterator)__position._M_current);
  }
  std::
  vector<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>::
  insert(&this->stack,
         (this->stack).
         super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
         ._M_impl.super__Vector_impl_data._M_start,layout);
  return;
}

Assistant:

void OverlayStack::Push(ILayoutPtr layout) {
    setOverlayStack(layout, this);

    auto it = std::find(
        this->stack.begin(),
        this->stack.end(), layout);

    if (it != this->stack.end()) {
        this->stack.erase(it); /* remove; we'll promote to the top */
    }

    this->stack.insert(this->stack.begin(), layout);
}